

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radiobox.cpp
# Opt level: O0

Element __thiscall ftxui::anon_unknown_3::RadioboxBase::Render(RadioboxBase *this)

{
  _Invoker_type p_Var1;
  bool bVar2;
  size_t __new_size;
  _Invoker_type p_Var3;
  int *piVar4;
  RadioboxOption *pRVar5;
  reference box;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RadioboxBase *in_RSI;
  Element EVar6;
  RadioboxOption *local_220;
  string *local_210;
  string *local_208;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *local_1f0;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_198;
  Decorator local_180;
  Decorator local_160;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_140;
  string local_120;
  Element local_100;
  shared_ptr<ftxui::Node> local_f0;
  string local_e0;
  shared_ptr<ftxui::Node> local_c0;
  Element local_b0;
  Element local_a0;
  value_type local_90;
  RadioboxOption *local_80;
  string *symbol;
  _func_Element_Element *focus_management;
  Decorator style;
  size_t i;
  undefined1 local_30 [7];
  bool is_focused;
  Elements elements;
  RadioboxBase *this_local;
  
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )local_30);
  bVar2 = ComponentBase::Focused(&in_RSI->super_ComponentBase);
  __new_size = ConstStringListRef::size(&in_RSI->entries_);
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::resize(&in_RSI->boxes_,__new_size);
  style._M_invoker = (_Invoker_type)0x0;
  while( true ) {
    p_Var1 = style._M_invoker;
    p_Var3 = (_Invoker_type)ConstStringListRef::size(&in_RSI->entries_);
    if (p_Var3 <= p_Var1) break;
    piVar4 = focused_entry(in_RSI);
    if ((*piVar4 == (int)style._M_invoker) && (bVar2)) {
      pRVar5 = Ref<ftxui::RadioboxOption>::operator->(&in_RSI->option_);
      local_1f0 = &pRVar5->style_focused;
    }
    else {
      pRVar5 = Ref<ftxui::RadioboxOption>::operator->(&in_RSI->option_);
      local_1f0 = &pRVar5->style_unfocused;
    }
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               &focus_management,local_1f0);
    piVar4 = focused_entry(in_RSI);
    if (*piVar4 == (int)style._M_invoker) {
      if (bVar2) {
        local_210 = (string *)focus;
      }
      else {
        local_210 = (string *)select;
      }
      local_208 = local_210;
    }
    else {
      local_208 = (string *)nothing;
    }
    symbol = local_208;
    if (*in_RSI->selected_ == (int)style._M_invoker) {
      local_220 = Ref<ftxui::RadioboxOption>::operator->(&in_RSI->option_);
    }
    else {
      local_220 = Ref<ftxui::RadioboxOption>::operator->(&in_RSI->option_);
      local_220 = (RadioboxOption *)&local_220->style_unchecked;
    }
    local_80 = local_220;
    std::__cxx11::string::string((string *)&local_e0,(string *)local_220);
    text((ftxui *)&local_c0,&local_e0);
    ConstStringListRef::operator[][abi_cxx11_(&local_120,&in_RSI->entries_,(size_t)style._M_invoker)
    ;
    text((ftxui *)&local_100,&local_120);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              (&local_140,
               (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               &focus_management);
    operator|((ftxui *)&local_f0,&local_100,&local_140);
    hbox<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
              ((ftxui *)&local_b0,&local_c0,&local_f0);
    std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
    function<std::shared_ptr<ftxui::Node>(*&)(std::shared_ptr<ftxui::Node>),void>
              ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_160,
               (_func_shared_ptr<ftxui::Node>_shared_ptr<ftxui::Node> **)&symbol);
    operator|((ftxui *)&local_a0,&local_b0,&local_160);
    box = std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::operator[]
                    (&in_RSI->boxes_,(size_type)style._M_invoker);
    reflect(&local_180,box);
    operator|((ftxui *)&local_90,&local_a0,&local_180);
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    push_back((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
               *)local_30,&local_90);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_90);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              (&local_180);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_a0);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              (&local_160);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_b0);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_f0);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              (&local_140);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               &focus_management);
    style._M_invoker = style._M_invoker + 1;
  }
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_198,
             (vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )local_30);
  vbox((ftxui *)this,&local_198);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_198);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )local_30);
  EVar6.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar6.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar6.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    Elements elements;
    bool is_focused = Focused();
    boxes_.resize(entries_.size());
    for (size_t i = 0; i < entries_.size(); ++i) {
      auto style = (focused_entry() == int(i) && is_focused)
                       ? option_->style_focused
                       : option_->style_unfocused;
      auto focus_management = (focused_entry() != int(i)) ? nothing
                              : is_focused                ? focus
                                                          : select;

      const std::string& symbol = *selected_ == int(i)
                                      ? option_->style_checked
                                      : option_->style_unchecked;
      elements.push_back(hbox(text(symbol), text(entries_[i]) | style) |
                         focus_management | reflect(boxes_[i]));
    }
    return vbox(std::move(elements));
  }